

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O0

void __thiscall
kj::ArrayBuilder<capnp::compiler::NodeTranslator::BrandScope_*>::dispose
          (ArrayBuilder<capnp::compiler::NodeTranslator::BrandScope_*> *this)

{
  BrandScope **firstElement;
  RemoveConst<capnp::compiler::NodeTranslator::BrandScope_*> *ppBVar1;
  BrandScope **ppBVar2;
  BrandScope **endCopy;
  BrandScope **posCopy;
  BrandScope **ptrCopy;
  ArrayBuilder<capnp::compiler::NodeTranslator::BrandScope_*> *this_local;
  
  firstElement = this->ptr;
  ppBVar1 = this->pos;
  ppBVar2 = this->endPtr;
  if (firstElement != (BrandScope **)0x0) {
    this->ptr = (BrandScope **)0x0;
    this->pos = (RemoveConst<capnp::compiler::NodeTranslator::BrandScope_*> *)0x0;
    this->endPtr = (BrandScope **)0x0;
    ArrayDisposer::dispose<capnp::compiler::NodeTranslator::BrandScope*>
              (this->disposer,firstElement,(long)ppBVar1 - (long)firstElement >> 3,
               (long)ppBVar2 - (long)firstElement >> 3);
  }
  return;
}

Assistant:

inline void dispose() {
    // Make sure that if an exception is thrown, we are left with a null ptr, so we won't possibly
    // dispose again.
    T* ptrCopy = ptr;
    T* posCopy = pos;
    T* endCopy = endPtr;
    if (ptrCopy != nullptr) {
      ptr = nullptr;
      pos = nullptr;
      endPtr = nullptr;
      disposer->dispose(ptrCopy, posCopy - ptrCopy, endCopy - ptrCopy);
    }
  }